

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuf.h
# Opt level: O2

void strbuf_append_mem(strbuf_t *s,char *c,int len)

{
  strbuf_ensure_empty_length(s,len);
  memcpy(s->buf + s->length,c,(ulong)(uint)len);
  s->length = s->length + len;
  return;
}

Assistant:

static inline void strbuf_append_mem(strbuf_t *s, const char *c, int len)
{
    strbuf_ensure_empty_length(s, len);
    memcpy(s->buf + s->length, c, len);
    s->length += len;
}